

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_main.c
# Opt level: O3

int oonf_main(int argc,char **argv,oonf_appdata *appdata)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  __uid_t _Var4;
  cfg_db *db;
  uint *puVar5;
  byte *pbVar6;
  char *pcVar7;
  int opt_idx;
  
  _schema_name = (char *)0x0;
  _display_schema = '\0';
  _debug_early = 0;
  _ignore_unknown = 0;
  memset(setup_signalhandler_act,0,0x98);
  sigemptyset((sigset_t *)(setup_signalhandler_act + 8));
  setup_signalhandler_act._136_4_ = 0;
  setup_signalhandler_act._0_8_ = quit_signal_handler;
  sigaction(2,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  sigaction(3,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  sigaction(4,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  sigaction(6,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  setup_signalhandler_act._0_8_ = 1;
  sigaction(0xd,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  sigaction(10,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  sigaction(0xc,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  setup_signalhandler_act._0_8_ = hup_signal_handler;
  sigaction(1,(sigaction *)setup_signalhandler_act,(sigaction *)0x0);
  _opterr = 0;
  iVar2 = getopt_long(argc,argv,"-");
  while (-1 < iVar2) {
    pbVar6 = &_debug_early;
    if (iVar2 == 0x101) {
LAB_0012fabd:
      *pbVar6 = 1;
    }
    else if (iVar2 == 0x102) {
      pbVar6 = &_ignore_unknown;
      goto LAB_0012fabd;
    }
    iVar2 = getopt_long(argc,argv,"-");
  }
  os_core_generic_syslog_init(appdata->app_name);
  iVar2 = oonf_log_init(appdata,(_debug_early ^ 1) * 3 + LOG_SEVERITY_DEBUG);
  if (iVar2 == 0) {
    oonf_subsystem_init();
    iVar3 = oonf_cfg_init(argc,argv,appdata->default_cfg_handler);
    iVar2 = 1;
    if (iVar3 == 0) {
      oonf_logcfg_init();
      iVar2 = parse_commandline(argc,argv,appdata,false);
      if (iVar2 == -1) {
        iVar2 = 1;
        iVar3 = oonf_cfg_update_globalcfg(true);
        if (iVar3 == 0) {
          db = oonf_cfg_get_rawdb();
          iVar3 = oonf_logcfg_apply(db);
          if ((iVar3 != 0) || (iVar3 = oonf_cfg_load_subsystems(), iVar3 != 0)) goto LAB_0012fb42;
          if (_display_schema == '\x01') {
            iVar2 = display_schema();
            goto LAB_0012fb42;
          }
          if ((appdata->need_root == true) && (_Var4 = geteuid(), _Var4 != 0)) {
            if ((log_global_mask[1] & 4) == 0) goto LAB_0012fb42;
            pcVar7 = "You must be root(uid = 0) to run %s!\n";
            iVar3 = 0xe2;
          }
          else if ((((config_global.lockfile != (char *)0x0 & appdata->need_lock) == 1) &&
                   (*config_global.lockfile != '\0')) &&
                  (((*config_global.lockfile != '-' || (config_global.lockfile[1] != '\0')) &&
                   (iVar3 = os_core_linux_create_lockfile(config_global.lockfile), iVar3 != 0)))) {
            if ((log_global_mask[1] & 4) == 0) goto LAB_0012fb42;
            pcVar7 = "Could not acquire application lock \'%s\'";
            iVar3 = 0xeb;
          }
          else {
            oonf_cfg_initplugins();
            iVar3 = oonf_cfg_apply();
            if ((iVar3 != 0) || (_Var1 = oonf_cfg_is_running(), !_Var1)) goto LAB_0012fb42;
            if (_handle_scheduling != (_func_int *)0x0) {
              if ((config_global.fork == true) && (_display_schema == '\0')) {
                iVar2 = daemon(0,0);
                if (iVar2 < 0) {
                  iVar2 = 1;
                  if ((log_global_mask[1] & 4) != 0) {
                    puVar5 = (uint *)__errno_location();
                    pcVar7 = strerror(*puVar5);
                    iVar2 = 1;
                    oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",0x10a,(void *)0x0,
                             0,"Could not fork into background: %s (%d)",pcVar7,(ulong)*puVar5);
                  }
                  goto LAB_0012fb42;
                }
                iVar2 = 1;
                if (((config_global.pidfile != (char *)0x0) && (*config_global.pidfile != '\0')) &&
                   (iVar3 = _write_pidfile(config_global.pidfile), iVar3 != 0)) goto LAB_0012fb42;
              }
              iVar2 = mainloop(argc,argv,appdata);
              oonf_subsystem_initiate_shutdown();
              do {
                iVar3 = (*_handle_scheduling)();
              } while (iVar3 == 0);
              goto LAB_0012fb42;
            }
            if ((log_global_mask[1] & 4) == 0) goto LAB_0012fb42;
            pcVar7 = "No event scheduler present";
            iVar3 = 0x102;
          }
        }
        else {
          if ((log_global_mask[1] & 4) == 0) goto LAB_0012fb42;
          iVar3 = 0xcb;
          pcVar7 = "Cannot read global configuration section (%d)";
        }
        iVar2 = 1;
        oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_main.c",iVar3,(void *)0x0,0,pcVar7);
      }
    }
  }
  else {
    iVar2 = 1;
  }
LAB_0012fb42:
  oonf_cfg_unconfigure_subsystems();
  oonf_subsystem_cleanup();
  oonf_logcfg_cleanup();
  oonf_cfg_cleanup();
  oonf_log_cleanup();
  os_core_generic_syslog_cleanup();
  return iVar2;
}

Assistant:

int
oonf_main(int argc, char **argv, const struct oonf_appdata *appdata) {
  int return_code;
  int result;

  /* early initialization */
  return_code = 1;

  _schema_name = NULL;
  _display_schema = false;
  _debug_early = false;
  _ignore_unknown = false;

  /* setup signal handler */
  _end_oonf_signal = false;
  setup_signalhandler();

  /* parse "early" command line arguments */
  parse_early_commandline(argc, argv);

  /* initialize core */
  os_core_init(appdata->app_name);

  /* initialize logger */
  if (oonf_log_init(appdata, _debug_early ? LOG_SEVERITY_DEBUG : LOG_SEVERITY_WARN)) {
    goto oonf_cleanup;
  }

  /* prepare plugin initialization */
  oonf_subsystem_init();

  /* initialize configuration system */
  if (oonf_cfg_init(argc, argv, appdata->default_cfg_handler)) {
    goto oonf_cleanup;
  }

  /* add custom configuration definitions */
  oonf_logcfg_init();

  /* parse command line and read configuration files */
  return_code = parse_commandline(argc, argv, appdata, false);
  if (return_code != -1) {
    /* end OONFd now */
    goto oonf_cleanup;
  }

  /* prepare for an error during initialization */
  return_code = 1;

  /* read global section early */
  if ((result = oonf_cfg_update_globalcfg(true))) {
    OONF_WARN(LOG_MAIN, "Cannot read global configuration section (%d)", result);
    goto oonf_cleanup;
  }

  /* configure logger */
  if (oonf_logcfg_apply(oonf_cfg_get_rawdb())) {
    goto oonf_cleanup;
  }

  /* load plugins */
  if (oonf_cfg_load_subsystems()) {
    goto oonf_cleanup;
  }

  /* show schema if necessary */
  if (_display_schema) {
    return_code = display_schema();
    goto oonf_cleanup;
  }

  /* check if we are root, otherwise stop */
  if (appdata->need_root) {
    if (geteuid() != 0) {
      OONF_WARN(LOG_MAIN, "You must be root(uid = 0) to run %s!\n", appdata->app_name);
      goto oonf_cleanup;
    }
  }

  if (appdata->need_lock && config_global.lockfile != NULL && *config_global.lockfile != 0 &&
      strcmp(config_global.lockfile, "-") != 0) {
    /* create application lock */
    if (os_core_create_lockfile(config_global.lockfile)) {
      OONF_WARN(LOG_MAIN, "Could not acquire application lock '%s'", config_global.lockfile);
      goto oonf_cleanup;
    }
  }

  /* call initialization callbacks of dynamic plugins */
  oonf_cfg_initplugins();

  /* apply configuration */
  if (oonf_cfg_apply()) {
    goto oonf_cleanup;
  }

  if (!oonf_cfg_is_running()) {
    /*
     * mayor error during late initialization
     * or maybe the user decided otherwise and pressed CTRL-C
     */
    return_code = _end_oonf_signal ? 0 : 1;
    goto oonf_cleanup;
  }

  if (!_handle_scheduling) {
    OONF_WARN(LOG_MAIN, "No event scheduler present");
    return_code = 1;
    goto oonf_cleanup;
  }
  /* see if we need to fork */
  if (config_global.fork && !_display_schema) {
    /* tell main process that we are finished with initialization */
    if (daemon(0, 0) < 0) {
      OONF_WARN(LOG_MAIN, "Could not fork into background: %s (%d)", strerror(errno), errno);
      goto oonf_cleanup;
    }

    if (config_global.pidfile && *config_global.pidfile != 0) {
      if (_write_pidfile(config_global.pidfile)) {
        goto oonf_cleanup;
      }
    }
  }

  /* activate mainloop */
  return_code = mainloop(argc, argv, appdata);

  /* tell plugins shutdown is in progress */
  oonf_subsystem_initiate_shutdown();

  /* wait for 500 ms and process socket events */
  while (!_handle_scheduling())
    ;

oonf_cleanup:
  /* free plugins */
  oonf_cfg_unconfigure_subsystems();
  oonf_subsystem_cleanup();

  /* free logging/config bridge resources */
  oonf_logcfg_cleanup();

  /* free configuration resources */
  oonf_cfg_cleanup();

  /* free logger resources */
  oonf_log_cleanup();

  /* free core resources */
  os_core_cleanup();

  return return_code;
}